

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTUINTEnc(octet *der,u32 tag,octet *val,size_t len)

{
  long lVar1;
  size_t sVar2;
  void *buf;
  octet *in_RCX;
  long in_RDX;
  long in_RDI;
  size_t tl_count;
  size_t ex;
  void *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  size_t in_stack_ffffffffffffffc8;
  octet *local_8;
  
  while( true ) {
    uVar3 = false;
    if ((octet *)0x1 < in_RCX) {
      uVar3 = in_RCX[in_RDX + -1] == '\0';
    }
    if ((bool)uVar3 == false) break;
    in_RCX = in_RCX + -1;
  }
  lVar1 = (long)(int)(uint)((in_RCX[in_RDX + -1] & 0x80) != 0);
  sVar2 = derTLEnc(in_RCX,0,in_stack_ffffffffffffffc8);
  if (sVar2 == 0xffffffffffffffff) {
    local_8 = (octet *)0xffffffffffffffff;
  }
  else {
    if (in_RDI != 0) {
      buf = (void *)(sVar2 + in_RDI);
      memCopy((void *)CONCAT17(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0x112e32);
      if (lVar1 != 0) {
        *(octet *)((long)buf + (long)in_RCX) = '\0';
      }
      memRev(buf,(size_t)(in_RCX + lVar1));
    }
    local_8 = in_RCX + lVar1 + sVar2;
  }
  return (size_t)local_8;
}

Assistant:

size_t derTUINTEnc(octet der[], u32 tag, const octet* val, size_t len)
{
	size_t ex;
	size_t tl_count;
	// pre
	ASSERT(len > 0);
	ASSERT(memIsValid(val, len));
	// исключить незначащие нули V
	while (len > 1 && val[len - 1] == 0)
		--len;
	// установлен старший бит V => дополнительный нулевой октет
	ex = (val[len - 1] & 128) ? 1 : 0;
	// кодировать T и L
	tl_count = derTLEnc(der, tag, len + ex);
	if (tl_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать V
	if (der)
	{
		ASSERT(memIsValid(der, tl_count + len + ex));
		der += tl_count;
		memCopy(der, val, len);
		if (ex)
			der[len] = 0;
		memRev(der, len + ex);
	}
	return tl_count + len + ex;
}